

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

void __thiscall raptor::TcpServer::OnSendEvent(TcpServer *this)

{
  void *in_RSI;
  
  OnSendEvent((TcpServer *)&this[-1]._last_timeout_time,in_RSI);
  return;
}

Assistant:

void TcpServer::OnSendEvent(void* ptr) {
    ConnectionId cid = (ConnectionId)ptr;
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        log_error("tcpserver: OnRecvEvent found invalid index, cid = %x", cid);
        return;
    }

    auto con = GetConnection(index);
    if (!con) return;
    if (con->DoSendEvent()) {
        RefreshTime(index);
        return;
    }
    con->Shutdown(true);
    DeleteConnection(index);
    log_error("tcpserver: Failed to post async send");
}